

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O0

ssize_t archive_write_newc_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  ulong in_RDX;
  long in_RDI;
  int ret;
  cpio_conflict1 *cpio;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_20;
  undefined8 local_8;
  
  puVar1 = *(ulong **)(in_RDI + 0xd0);
  local_20 = in_RDX;
  if (*puVar1 < in_RDX) {
    local_20 = *puVar1;
  }
  iVar2 = __archive_write_output
                    ((archive_write *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,0x2996a4);
  *puVar1 = *puVar1 - local_20;
  if (iVar2 < 0) {
    local_8 = (ulong)iVar2;
  }
  else {
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

static ssize_t
archive_write_newc_data(struct archive_write *a, const void *buff, size_t s)
{
	struct cpio *cpio;
	int ret;

	cpio = (struct cpio *)a->format_data;
	if (s > cpio->entry_bytes_remaining)
		s = (size_t)cpio->entry_bytes_remaining;

	ret = __archive_write_output(a, buff, s);
	cpio->entry_bytes_remaining -= s;
	if (ret >= 0)
		return (s);
	else
		return (ret);
}